

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalGenerator::GetLanguageOutputExtension_abi_cxx11_
          (string *__return_storage_ptr__,cmGlobalGenerator *this,cmSourceFile *source)

{
  string *__x;
  size_type sVar1;
  allocator<char> local_41;
  string local_40;
  
  cmSourceFile::GetLanguage_abi_cxx11_(&local_40,source);
  if (local_40._M_string_length == 0) {
    __x = cmSourceFile::GetExtension_abi_cxx11_(source);
    if (__x->_M_string_length != 0) {
      sVar1 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::count(&this->OutputExtensions,__x);
      if (sVar1 != 0) {
        std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)__x);
        goto LAB_002ba81a;
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_41);
  }
  else {
    GetLanguageOutputExtension(__return_storage_ptr__,this,&local_40);
  }
LAB_002ba81a:
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GetLanguageOutputExtension(
  cmSourceFile const& source) const
{
  const std::string& lang = source.GetLanguage();
  if (!lang.empty()) {
    return this->GetLanguageOutputExtension(lang);
  }
  // if no language is found then check to see if it is already an
  // output extension for some language.  In that case it should be ignored
  // and in this map, so it will not be compiled but will just be used.
  std::string const& ext = source.GetExtension();
  if (!ext.empty()) {
    if (this->OutputExtensions.count(ext)) {
      return ext;
    }
  }
  return "";
}